

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger string_find(HSQUIRRELVM v)

{
  HSQUIRRELVM v_00;
  SQRESULT SVar1;
  SQInteger SVar2;
  char *pcVar3;
  HSQUIRRELVM in_RDI;
  SQChar *ret;
  SQChar *substr;
  SQChar *str;
  SQInteger start_idx;
  SQInteger top;
  SQChar **in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  long idx;
  SQInteger in_stack_fffffffffffffff8;
  
  idx = 0;
  v_00 = (HSQUIRRELVM)sq_gettop(in_RDI);
  if ((((long)v_00 < 2) ||
      (SVar1 = sq_getstring(in_stack_ffffffffffffffd8,(SQInteger)in_stack_ffffffffffffffd0,
                            in_stack_ffffffffffffffc8), SVar1 < 0)) ||
     (SVar1 = sq_getstring(in_stack_ffffffffffffffd8,(SQInteger)in_stack_ffffffffffffffd0,
                           in_stack_ffffffffffffffc8), SVar1 < 0)) {
    SVar1 = sq_throwerror(in_stack_ffffffffffffffd0,(SQChar *)in_stack_ffffffffffffffc8);
  }
  else {
    if (2 < (long)v_00) {
      sq_getinteger(v_00,idx,(SQInteger *)in_stack_ffffffffffffffd8);
    }
    SVar2 = sq_getsize(in_stack_ffffffffffffffd8,(SQInteger)in_stack_ffffffffffffffd0);
    if (((idx < SVar2) && (-1 < idx)) &&
       (pcVar3 = strstr((char *)((long)&(in_stack_ffffffffffffffd8->super_SQCollectable).
                                        super_SQRefCounted._vptr_SQRefCounted + idx),
                        (char *)in_stack_ffffffffffffffd0), pcVar3 != (char *)0x0)) {
      sq_pushinteger((HSQUIRRELVM)ret,in_stack_fffffffffffffff8);
      SVar1 = 1;
    }
    else {
      SVar1 = 0;
    }
  }
  return SVar1;
}

Assistant:

static SQInteger string_find(HSQUIRRELVM v)
{
    SQInteger top,start_idx=0;
    const SQChar *str,*substr,*ret;
    if(((top=sq_gettop(v))>1) && SQ_SUCCEEDED(sq_getstring(v,1,&str)) && SQ_SUCCEEDED(sq_getstring(v,2,&substr))){
        if(top>2)sq_getinteger(v,3,&start_idx);
        if((sq_getsize(v,1)>start_idx) && (start_idx>=0)){
            ret=scstrstr(&str[start_idx],substr);
            if(ret){
                sq_pushinteger(v,(SQInteger)(ret-str));
                return 1;
            }
        }
        return 0;
    }
    return sq_throwerror(v,_SC("invalid param"));
}